

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid,char *project,char *options)

{
  REF_INT RVar1;
  REF_NODE pRVar2;
  REF_NODE ref_node;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  REF_CELL pRVar10;
  bool bVar11;
  ulong uStackY_920;
  REF_INT nqua;
  REF_INT ntri;
  REF_CELL local_908;
  REF_INT local_900;
  int local_8fc;
  REF_INT face_id;
  REF_INT new_node;
  REF_INT ntet;
  REF_INT nnode;
  REF_DBL xyz [3];
  REF_GLOB global;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  char command [1024];
  char filename [1024];
  
  pRVar2 = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)pRVar2->n,(ulong)(uint)ref_grid->cell[3]->n)
  ;
  snprintf(filename,0x400,"%s-aflr-surface.lb8.ugrid",project);
  uVar4 = ref_export_by_extension(ref_grid,filename);
  if (uVar4 != 0) {
    uStackY_920 = (ulong)uVar4;
    pcVar9 = "ugrid";
    uVar8 = 0x97b;
    goto LAB_00194d99;
  }
  if (options == (char *)0x0) {
    pcVar9 = 
    "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid -mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 < /dev/null > %s-aflr.txt"
    ;
    options = project;
  }
  else {
    pcVar9 = 
    "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid %s < /dev/null > %s-aflr.txt"
    ;
  }
  snprintf(command,0x400,pcVar9,project,project,options);
  puts(command);
  fflush(_stdout);
  iVar5 = system(command);
  if (iVar5 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x98e,
           "ref_geom_aflr_volume","aflr failed",0,(long)iVar5);
    return 1;
  }
  RVar1 = pRVar2->n;
  snprintf(filename,0x400,"%s-aflr-volume.ugrid");
  ref_node = ref_grid->node;
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    iVar5 = __isoc99_fscanf(__stream,"%d",&nnode);
    if (iVar5 == 1) {
      iVar5 = __isoc99_fscanf(__stream,"%d",&ntri);
      if (iVar5 == 1) {
        iVar5 = __isoc99_fscanf(__stream,"%d",&nqua);
        if (iVar5 == 1) {
          iVar5 = __isoc99_fscanf(__stream,"%d",&ntet);
          if (iVar5 == 1) {
            iVar5 = __isoc99_fscanf(__stream,"%d",&npyr);
            if (iVar5 == 1) {
              iVar5 = __isoc99_fscanf(__stream,"%d",&npri);
              if (iVar5 == 1) {
                iVar5 = __isoc99_fscanf(__stream,"%d",&nhex);
                if (iVar5 == 1) {
                  iVar5 = ref_node->n;
                  pRVar10 = (REF_CELL)0x0;
                  local_900 = RVar1;
LAB_00194f9a:
                  if ((long)nnode <= (long)pRVar10) goto LAB_001951fe;
                  local_908 = pRVar10;
                  iVar6 = __isoc99_fscanf(__stream,"%lf",xyz);
                  if (iVar6 == 1) {
                    iVar6 = __isoc99_fscanf(__stream,"%lf",xyz + 1);
                    if (iVar6 != 1) {
                      global = (REF_GLOB)iVar6;
                      pcVar9 = "y";
                      pRVar10 = (REF_CELL)0x1;
                      uVar8 = 0x940;
                      goto LAB_0019539e;
                    }
                    iVar6 = __isoc99_fscanf(__stream,"%lf",xyz + 2);
                    pRVar10 = local_908;
                    if (iVar6 != 1) {
                      global = (REF_GLOB)iVar6;
                      pcVar9 = "z";
                      pRVar10 = (REF_CELL)0x1;
                      uVar8 = 0x941;
                      goto LAB_0019539e;
                    }
                    if ((long)local_908 < (long)iVar5) {
LAB_0019507e:
                      pRVar10 = (REF_CELL)((long)&pRVar10->type + 1);
                      goto LAB_00194f9a;
                    }
                    uVar4 = ref_node_next_global(ref_node,&global);
                    if (uVar4 != 0) {
                      uStackY_920 = (ulong)uVar4;
                      pcVar9 = "next global";
                      uVar8 = 0x943;
                      goto LAB_00195365;
                    }
                    if (pRVar10 != (REF_CELL)global) {
                      pcVar9 = "global node index";
                      uVar8 = 0x944;
                      goto LAB_0019539e;
                    }
                    uVar4 = ref_node_add(ref_node,(REF_GLOB)pRVar10,&new_node);
                    if (uVar4 != 0) {
                      uStackY_920 = (ulong)uVar4;
                      pcVar9 = "new_node";
                      uVar8 = 0x945;
                      goto LAB_00195365;
                    }
                    if (pRVar10 == (REF_CELL)(ulong)(uint)new_node) {
                      pRVar3 = ref_node->real;
                      lVar7 = (long)(new_node * 0xf);
                      pRVar3[lVar7] = xyz[0];
                      pRVar3[lVar7 + 1] = xyz[1];
                      pRVar3[lVar7 + 2] = xyz[2];
                      goto LAB_0019507e;
                    }
                    global = (REF_GLOB)new_node;
                    pcVar9 = "node index";
                    uVar8 = 0x946;
                  }
                  else {
                    global = (REF_GLOB)iVar6;
                    pcVar9 = "x";
                    pRVar10 = (REF_CELL)0x1;
                    uVar8 = 0x93f;
                  }
LAB_0019539e:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,uVar8,"ref_import_ugrid_tets",pcVar9,pRVar10,global);
                  goto LAB_001951d5;
                }
                pcVar9 = "nhex";
                uVar8 = 0x93a;
              }
              else {
                pcVar9 = "npri";
                uVar8 = 0x939;
              }
            }
            else {
              pcVar9 = "npyr";
              uVar8 = 0x938;
            }
          }
          else {
            pcVar9 = "ntet";
            uVar8 = 0x937;
          }
        }
        else {
          pcVar9 = "nqua";
          uVar8 = 0x936;
        }
      }
      else {
        pcVar9 = "ntri";
        uVar8 = 0x935;
      }
    }
    else {
      pcVar9 = "nnode";
      uVar8 = 0x934;
    }
    goto LAB_001951ce;
  }
  printf("unable to open %s\n",filename);
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x932,
         "ref_import_ugrid_tets","unable to open file");
  uStackY_920 = 2;
  goto LAB_001951d8;
LAB_001951fe:
  for (iVar5 = 0; iVar5 < ntri; iVar5 = iVar5 + 1) {
    lVar7 = 0;
    while (lVar7 + 4 != 0x10) {
      iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar7);
      lVar7 = lVar7 + 4;
      if (iVar6 != 1) {
        pcVar9 = "tri";
        uVar8 = 0x94f;
        goto LAB_001951ce;
      }
    }
  }
  for (iVar5 = 0; iVar5 < nqua; iVar5 = iVar5 + 1) {
    lVar7 = 0;
    while (lVar7 + 4 != 0x14) {
      iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar7);
      lVar7 = lVar7 + 4;
      if (iVar6 != 1) {
        pcVar9 = "qua";
        uVar8 = 0x953;
        goto LAB_001951ce;
      }
    }
  }
  iVar5 = -1;
  do {
    iVar5 = iVar5 + 1;
    if (ntri <= iVar5) {
      iVar5 = -1;
      goto LAB_0019546f;
    }
    iVar6 = __isoc99_fscanf(__stream,"%d",&face_id);
  } while (iVar6 == 1);
  pcVar9 = "tri id";
  uVar8 = 0x957;
  goto LAB_001951ce;
LAB_001954c5:
  if (ntet <= iVar5) {
    fclose(__stream);
    printf("%d interior nodes\n",(ulong)(uint)(pRVar2->n - local_900));
    ref_grid->surf = 0;
    return 0;
  }
  lVar7 = 0;
  while (lVar7 + 4 != 0x14) {
    iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_8a8 + lVar7);
    lVar7 = lVar7 + 4;
    if (iVar6 != 1) {
      pcVar9 = "tet";
      uVar8 = 0x961;
      goto LAB_001951ce;
    }
  }
  local_8a8 = local_8a8 + -1;
  iStack_8a4 = iStack_8a4 + -1;
  iStack_8a0 = iStack_8a0 + -1;
  iStack_89c = iStack_89c + -1;
  uVar4 = ref_cell_add(local_908,&local_8a8,&local_8fc);
  if (uVar4 == 0) goto code_r0x0019552b;
  uStackY_920 = (ulong)uVar4;
  pcVar9 = "new tet";
  uVar8 = 0x966;
LAB_00195365:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_import_ugrid_tets",uStackY_920,pcVar9);
  goto LAB_001951d8;
code_r0x0019552b:
  bVar11 = iVar5 != local_8fc;
  iVar5 = iVar5 + 1;
  if (bVar11) goto code_r0x00195539;
  goto LAB_001954c5;
code_r0x00195539:
  pcVar9 = "tet index";
  uVar8 = 0x967;
  goto LAB_001951ce;
  while (iVar6 = __isoc99_fscanf(__stream,"%d",&face_id), iVar6 == 1) {
LAB_0019546f:
    iVar5 = iVar5 + 1;
    if (nqua <= iVar5) {
      local_908 = ref_grid->cell[8];
      iVar5 = 0;
      goto LAB_001954c5;
    }
  }
  pcVar9 = "qua id";
  uVar8 = 0x95b;
LAB_001951ce:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_import_ugrid_tets",pcVar9);
LAB_001951d5:
  uStackY_920 = 1;
LAB_001951d8:
  pcVar9 = "tets only";
  uVar8 = 0x993;
LAB_00194d99:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_geom_aflr_volume",uStackY_920,pcVar9);
  return (REF_STATUS)uStackY_920;
}

Assistant:

REF_FCN REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid, const char *project,
                                        const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  char filename[1024];
  char command[1024];
  int system_status;
  REF_INT nnode_surface;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 1024, "%s-aflr-surface.lb8.ugrid", project);
  RSS(ref_export_by_extension(ref_grid, filename), "ugrid");
  if (NULL == options) {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "-mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 "
        "< /dev/null > %s-aflr.txt",
        project, project, project);
  } else {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "%s "
        "< /dev/null > %s-aflr.txt",
        project, project, options, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  system_status = system(command);
  REIS(0, system_status, "aflr failed");

  nnode_surface = ref_node_n(ref_node);

  snprintf(filename, 1024, "%s-aflr-volume.ugrid", project);
  RSS(ref_import_ugrid_tets(ref_grid, filename), "tets only");

  printf("%d interior nodes\n", ref_node_n(ref_node) - nnode_surface);

  ref_grid_surf(ref_grid) = REF_FALSE;

  return REF_SUCCESS;
}